

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

bool __thiscall dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks(CFGStructurizer *this)

{
  pointer ppCVar1;
  CFGNode *start_node;
  CFGNode *node;
  pointer ppCVar2;
  pointer ppCVar3;
  bool bVar4;
  Id IVar5;
  CFGNode *to;
  Builder *pBVar6;
  size_t i_1;
  ulong uVar7;
  pointer ppCVar8;
  size_t i;
  ulong uVar9;
  ThreadLocalAllocator<char> local_c9;
  CFGNode *invalid_target;
  uint32_t local_bc;
  IncomingValue incoming;
  undefined1 local_88 [24];
  pointer pIStack_70;
  pointer local_68;
  size_t local_60;
  __node_base_ptr p_Stack_58;
  CFGNode *merge;
  
  invalid_target = (CFGNode *)0x0;
  ppCVar8 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppCVar8 == ppCVar1) goto LAB_0012d7d2;
    start_node = *ppCVar8;
    if ((start_node->merge == Loop) && (start_node->freeze_structured_analysis == true)) {
      merge = start_node->loop_merge_block;
      if (merge != (CFGNode *)0x0) {
        bVar4 = CFGNode::post_dominates(merge,start_node);
        if (!bVar4) {
          incoming.block = (CFGNode *)&merge;
          incoming._8_8_ = &invalid_target;
          local_88._8_8_ = 1;
          local_88._16_8_ = (_Hash_node_base *)0x0;
          pIStack_70 = (pointer)0x0;
          local_68 = (pointer)CONCAT44(local_68._4_4_,1.0);
          local_60 = 0;
          p_Stack_58 = (__node_base_ptr)0x0;
          local_88._0_8_ = &p_Stack_58;
          CFGNode::
          traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
                    (start_node,(UnorderedSet<const_CFGNode_*> *)local_88,start_node,
                     (anon_class_24_3_8fce9826 *)&incoming);
          std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_88);
          if (invalid_target != (CFGNode *)0x0) {
            node = start_node->loop_merge_block;
            to = create_helper_pred_block(this,node);
            start_node->loop_merge_block = to;
            uVar7 = (long)(to->pred).
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(to->pred).
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
            traverse_dominated_blocks_and_rewrite_branch(this,start_node,invalid_target,to);
            local_68 = (pointer)0x0;
            local_88._16_8_ = (_Hash_node_base *)0x0;
            pIStack_70 = (pointer)0x0;
            local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
            local_bc = SPIRVModule::allocate_id(this->module);
            local_88._0_4_ = local_bc;
            pBVar6 = SPIRVModule::get_builder(this->module);
            IVar5 = spv::Builder::makeBoolType(pBVar6);
            local_88._4_4_ = IVar5;
            pBVar6 = SPIRVModule::get_builder(this->module);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                          *)&merge,"break_selector_",&local_c9);
            std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                            *)&incoming,
                           (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                            *)&merge,&node->name);
            spv::Builder::addName(pBVar6,local_bc,(char *)incoming.block);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)&incoming);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)&merge);
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              incoming._8_8_ = incoming._8_8_ & 0xffffffff00000000;
              incoming.block =
                   (to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9];
              pBVar6 = SPIRVModule::get_builder(this->module);
              IVar5 = spv::Builder::makeBoolConstant(pBVar6,true,false);
              incoming.id = IVar5;
              std::
              vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                           *)(local_88 + 0x10),&incoming);
            }
            ppCVar2 = (to->pred).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppCVar3 = (to->pred).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (; uVar7 < (ulong)((long)ppCVar2 - (long)ppCVar3 >> 3); uVar7 = uVar7 + 1) {
              incoming._8_8_ = incoming._8_8_ & 0xffffffff00000000;
              incoming.block =
                   (to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7];
              pBVar6 = SPIRVModule::get_builder(this->module);
              IVar5 = spv::Builder::makeBoolConstant(pBVar6,false,false);
              incoming.id = IVar5;
              std::
              vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                           *)(local_88 + 0x10),&incoming);
            }
            (to->ir).terminator.type = Condition;
            (to->ir).terminator.true_block = node;
            (to->ir).terminator.false_block = invalid_target;
            (to->ir).terminator.direct_block = (CFGNode *)0x0;
            (to->ir).terminator.conditional_id = local_88._0_4_;
            std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
            emplace_back<dxil_spv::PHI>(&(to->ir).phi,(PHI *)local_88);
            CFGNode::add_branch(to,invalid_target);
            recompute_cfg(this);
            std::
            _Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ::~_Vector_base((_Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                             *)(local_88 + 0x10));
LAB_0012d7d2:
            return ppCVar8 != ppCVar1;
          }
        }
      }
    }
    ppCVar8 = ppCVar8 + 1;
  } while( true );
}

Assistant:

bool CFGStructurizer::rewrite_invalid_loop_breaks()
{
	// Keep iterating here until we have validated a clean CFG w.r.t. block-like loops.
	// This should pass through first time without issue with extremely high probability,
	// so hitting the slow path isn't a real concern until proven otherwise.
	CFGNode *rewrite_header = nullptr;
	CFGNode *invalid_target = nullptr;

	// Process from inside out.
	for (auto *node : forward_post_visit_order)
	{
		// Structured loop constructs can end up with problematic merge scenarios where we missed
		// some cases where blocks branch outside our construct.
		// At some point, we were considered mere selection constructs and breaking out of it is fine,
		// but if the selection is promoted to a loop at some point after this analysis, we are a bit screwed.
		// This can happen in complex ladder resolve scenarios.
		// The fix-up means introducing multiple levels of ladder blocks.
		if (node->merge == MergeType::Loop && node->freeze_structured_analysis)
		{
			auto *merge = node->loop_merge_block;
			if (!merge || merge->post_dominates(node))
				continue;

			node->traverse_dominated_blocks([&](CFGNode *candidate) {
				if (candidate == merge || invalid_target)
					return false;

				// If the succ can reach outside the loop construct, we have an error condition.
				for (auto *succ : candidate->succ)
				{
					if (!query_reachability(*succ, *merge))
					{
						// Determine if we're an inner terminate/return, or a loop exit.
						// If the common post-dominator is EXIT node, this is a return-like relationship,
						// and we skip any fixup.
						auto *pdom = CFGNode::find_common_post_dominator(succ, merge);
						if (pdom != nullptr && !pdom->pred.empty())
							invalid_target = succ;
					}
				}
				return true;
			});

			if (invalid_target)
			{
				rewrite_header = node;
				break;
			}
		}
	}

	if (invalid_target)
	{
		auto *merge = rewrite_header->loop_merge_block;
		auto *dispatcher = create_helper_pred_block(merge);
		rewrite_header->loop_merge_block = dispatcher;

		size_t natural_preds = dispatcher->pred.size();
		traverse_dominated_blocks_and_rewrite_branch(rewrite_header, invalid_target, dispatcher);

		PHI phi;
		phi.id = module.allocate_id();
		phi.type_id = module.get_builder().makeBoolType();
		module.get_builder().addName(phi.id, (String("break_selector_") + merge->name).c_str());

		for (size_t i = 0; i < natural_preds; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(true);
			phi.incoming.push_back(incoming);
		}

		for (size_t i = natural_preds, n = dispatcher->pred.size(); i < n; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(false);
			phi.incoming.push_back(incoming);
		}

		dispatcher->ir.terminator.type = Terminator::Type::Condition;
		dispatcher->ir.terminator.true_block = merge;
		dispatcher->ir.terminator.false_block = invalid_target;
		dispatcher->ir.terminator.direct_block = nullptr;
		dispatcher->ir.terminator.conditional_id = phi.id;

		dispatcher->ir.phi.push_back(std::move(phi));
		dispatcher->add_branch(invalid_target);

		recompute_cfg();
		return true;
	}

	return false;
}